

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O2

vm_obj_id_t CVmObjTimeZone::create_from_stack(uchar **pc_ptr,uint argc)

{
  vm_obj_id_t obj_id;
  CVmTimeZone *tz;
  CVmObjTimeZone *this;
  
  tz = parse_ctor_args(sp_ + -1,argc);
  obj_id = vm_new_id(0,0,0);
  this = (CVmObjTimeZone *)CVmObject::operator_new(0x10,obj_id);
  CVmObjTimeZone(this,tz);
  return obj_id;
}

Assistant:

void CVmObjTimeZone::set_prop(VMG_ class CVmUndo *undo,
                              vm_obj_id_t self, vm_prop_id_t prop,
                              const vm_val_t *val)
{
    /* no settable properties - throw an error */
    err_throw(VMERR_INVALID_SETPROP);
}